

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionCond.cpp
# Opt level: O1

Instruction *
Hpipe::InstructionCond::make_cond
          (Node *node,PtrPool<Hpipe::Instruction,_32> *inst_pool,Cond *not_in,bool in_a_cycle,
          InstructionMark *mark,int off_data)

{
  Vec<Hpipe::Transition> *pVVar1;
  uchar b;
  Node *pNVar2;
  bool bVar3;
  Node *pNVar4;
  int iVar5;
  Instruction *pIVar6;
  InstructionMark *pIVar7;
  InstructionCond *pIVar8;
  Instruction *pIVar9;
  undefined7 in_register_00000009;
  undefined1 uVar10;
  Cond cond;
  Cond local_128;
  undefined4 local_fc;
  Node *local_f8;
  InstructionCond *local_f0;
  int local_e4;
  Context local_e0;
  Instruction *local_70;
  InstructionMark *local_68;
  Cond *local_60;
  Cond local_58;
  Node *local_38;
  
  pNVar2 = (node->ok).data;
  if (pNVar2 == (Node *)0x0) {
    pIVar8 = (InstructionCond *)node->inst;
  }
  else {
    local_fc = (undefined4)CONCAT71(in_register_00000009,in_a_cycle);
    local_f0 = (InstructionCond *)pNVar2->freq;
    local_f8 = (Node *)((node->ko).data)->freq;
    local_68 = mark;
    if (node->use_equ == true) {
      b = (uchar)node->beg;
      Cond::Cond(&local_58,b,b);
      pIVar8 = (InstructionCond *)operator_new(0x1c0);
      if ((double)local_f8 <= (double)local_f0) {
        local_f8 = (Node *)inst_pool;
        local_e4 = off_data;
        Context::Context(&local_e0,0);
        InstructionCond(pIVar8,&local_e0,&local_58,off_data,not_in);
        local_f0 = PtrPool<Hpipe::Instruction,32>::operator<<
                             ((PtrPool<Hpipe::Instruction,32> *)local_f8,pIVar8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
        ::~_Rb_tree(&local_e0.paths_to_strings._M_t);
        if (local_e0.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e0.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pNVar2 = (node->ok).data;
        Cond::operator~(&local_58);
        Cond::operator|((Cond *)&local_e0,not_in,&local_128);
        iVar5 = local_e4;
        pNVar4 = local_f8;
        bVar3 = local_fc._0_1_;
        local_60 = not_in;
        local_70 = make_cond(pNVar2,(PtrPool<Hpipe::Instruction,_32> *)local_f8,(Cond *)&local_e0,
                             local_fc._0_1_,mark,local_e4);
        pNVar2 = (node->ko).data;
        Cond::operator|((Cond *)&local_e0,local_60,&local_58);
        pIVar6 = local_70;
        pIVar9 = make_cond(pNVar2,(PtrPool<Hpipe::Instruction,_32> *)pNVar4,(Cond *)&local_e0,bVar3,
                           mark,iVar5);
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,pIVar6,(Vec<unsigned_int> *)&local_128,
                   ((node->ok).data)->freq);
        pIVar8 = local_f0;
        pVVar1 = &(local_f0->super_Instruction).next;
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e0);
        uVar10 = (undefined1)local_fc;
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,&pIVar8->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar6->prev,
                   (Transition *)&local_e0);
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,pIVar9,(Vec<unsigned_int> *)&local_128,
                   ((node->ko).data)->freq);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e0);
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,&pIVar8->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar9->prev,
                   (Transition *)&local_e0);
      }
      else {
        local_e4 = off_data;
        Context::Context(&local_e0,0);
        Cond::operator~(&local_58);
        InstructionCond(pIVar8,&local_e0,&local_128,off_data,not_in);
        local_f0 = PtrPool<Hpipe::Instruction,32>::operator<<
                             ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
        ::~_Rb_tree(&local_e0.paths_to_strings._M_t);
        if (local_e0.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e0.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pNVar2 = (node->ko).data;
        Cond::operator|((Cond *)&local_e0,not_in,&local_58);
        pIVar7 = local_68;
        iVar5 = local_e4;
        bVar3 = local_fc._0_1_;
        local_70 = make_cond(pNVar2,inst_pool,(Cond *)&local_e0,local_fc._0_1_,local_68,local_e4);
        local_38 = (node->ok).data;
        local_f8 = node;
        Cond::operator~(&local_58);
        Cond::operator|((Cond *)&local_e0,not_in,&local_128);
        pIVar6 = local_70;
        pNVar2 = local_f8;
        pIVar9 = make_cond(local_38,inst_pool,(Cond *)&local_e0,bVar3,pIVar7,iVar5);
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,pIVar6,(Vec<unsigned_int> *)&local_128,
                   ((pNVar2->ko).data)->freq);
        pIVar8 = local_f0;
        pVVar1 = &(local_f0->super_Instruction).next;
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e0);
        uVar10 = (undefined1)local_fc;
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,&pIVar8->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar6->prev,
                   (Transition *)&local_e0);
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,pIVar9,(Vec<unsigned_int> *)&local_128,
                   ((pNVar2->ok).data)->freq);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e0);
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,&pIVar8->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar9->prev,
                   (Transition *)&local_e0);
      }
    }
    else {
      Cond::Cond(&local_58,(uchar)node->beg,0xff);
      pIVar8 = (InstructionCond *)operator_new(0x1c0);
      if ((double)local_f8 <= (double)local_f0) {
        local_60 = not_in;
        Context::Context(&local_e0,0);
        Cond::operator~(&local_58);
        InstructionCond(pIVar8,&local_e0,&local_128,off_data,not_in);
        local_f0 = PtrPool<Hpipe::Instruction,32>::operator<<
                             ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
        ::~_Rb_tree(&local_e0.paths_to_strings._M_t);
        if (local_e0.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e0.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pNVar2 = (node->ok).data;
        Cond::operator|((Cond *)&local_e0,not_in,&local_58);
        pIVar7 = local_68;
        bVar3 = local_fc._0_1_;
        local_70 = make_cond(pNVar2,inst_pool,(Cond *)&local_e0,local_fc._0_1_,local_68,off_data);
        pNVar2 = (node->ko).data;
        local_f8 = node;
        Cond::operator~(&local_58);
        Cond::operator|((Cond *)&local_e0,local_60,&local_128);
        pIVar6 = local_70;
        pNVar4 = local_f8;
        pIVar9 = make_cond(pNVar2,inst_pool,(Cond *)&local_e0,bVar3,pIVar7,off_data);
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,pIVar6,(Vec<unsigned_int> *)&local_128,
                   ((pNVar4->ok).data)->freq);
        pIVar8 = local_f0;
        pVVar1 = &(local_f0->super_Instruction).next;
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e0);
        uVar10 = (undefined1)local_fc;
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,&pIVar8->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar6->prev,
                   (Transition *)&local_e0);
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,pIVar9,(Vec<unsigned_int> *)&local_128,
                   ((pNVar4->ko).data)->freq);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e0);
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,&pIVar8->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar9->prev,
                   (Transition *)&local_e0);
      }
      else {
        local_f8 = (Node *)inst_pool;
        local_60 = not_in;
        Context::Context(&local_e0,0);
        InstructionCond(pIVar8,&local_e0,&local_58,off_data,not_in);
        local_f0 = PtrPool<Hpipe::Instruction,32>::operator<<
                             ((PtrPool<Hpipe::Instruction,32> *)local_f8,pIVar8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
        ::~_Rb_tree(&local_e0.paths_to_strings._M_t);
        if (local_e0.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e0.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_e4 = off_data;
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pNVar2 = (node->ko).data;
        Cond::operator~(&local_58);
        Cond::operator|((Cond *)&local_e0,not_in,&local_128);
        iVar5 = local_e4;
        pNVar4 = local_f8;
        bVar3 = local_fc._0_1_;
        local_70 = make_cond(pNVar2,(PtrPool<Hpipe::Instruction,_32> *)local_f8,(Cond *)&local_e0,
                             local_fc._0_1_,mark,local_e4);
        pNVar2 = (node->ok).data;
        Cond::operator|((Cond *)&local_e0,local_60,&local_58);
        pIVar6 = local_70;
        pIVar9 = make_cond(pNVar2,(PtrPool<Hpipe::Instruction,_32> *)pNVar4,(Cond *)&local_e0,bVar3,
                           mark,iVar5);
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,pIVar6,(Vec<unsigned_int> *)&local_128,
                   ((node->ko).data)->freq);
        pIVar8 = local_f0;
        pVVar1 = &(local_f0->super_Instruction).next;
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e0);
        uVar10 = (undefined1)local_fc;
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,&pIVar8->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar6->prev,
                   (Transition *)&local_e0);
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,pIVar9,(Vec<unsigned_int> *)&local_128,
                   ((node->ok).data)->freq);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e0);
        if (local_e0.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e0.mark -
                          (long)local_e0.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e0,&pIVar8->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar9->prev,
                   (Transition *)&local_e0);
      }
    }
    pIVar7 = local_68;
    if (local_e0.pos.super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
        .super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      operator_delete(local_e0.pos.
                      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      .
                      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                      (long)local_e0.mark -
                      (long)local_e0.pos.
                            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            .
                            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
      operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                      local_128.p.super__Base_bitset<4UL>._M_w[2] -
                      local_128.p.super__Base_bitset<4UL>._M_w[0]);
    }
    (pIVar8->super_Instruction).in_a_cycle = (bool)uVar10;
    (pIVar8->super_Instruction).mark = pIVar7;
  }
  return &pIVar8->super_Instruction;
}

Assistant:

Instruction *InstructionCond::make_cond( const BranchSet::Node *node, PtrPool<Instruction> &inst_pool, const Cond &not_in, bool in_a_cycle, InstructionMark *mark, int off_data ) {
    if ( node->ok ) {
        bool use_neg = node->ok->freq < node->ko->freq;
        if ( node->use_equ ) {
            Cond cond( node->beg, node->beg );
            if ( use_neg ) {
                Instruction *res = inst_pool << new InstructionCond( {}, ~ cond, off_data, not_in );
                Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
                Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
                res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
                res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
                res->in_a_cycle = in_a_cycle;
                res->mark = mark;
                return res;
            }
            Instruction *res = inst_pool << new InstructionCond( {}, cond, off_data, not_in );
            Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
            Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
            res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
            res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
            res->in_a_cycle = in_a_cycle;
            res->mark = mark;
            return res;
        }
        Cond cond( node->beg, 255 );
        if ( use_neg ) {
            Instruction *res = inst_pool << new InstructionCond( {}, cond, off_data, not_in );
            Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
            Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
            res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
            res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
            res->in_a_cycle = in_a_cycle;
            res->mark = mark;
            return res;
        }
        Instruction *res = inst_pool << new InstructionCond( {}, ~ cond, off_data, not_in );
        Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
        Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
        res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
        res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
        res->in_a_cycle = in_a_cycle;
        res->mark = mark;
        return res;
    }
    return node->inst;
}